

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlinuxfbdrmscreen.cpp
# Opt level: O2

void __thiscall QLinuxFbDevice::QLinuxFbDevice(QLinuxFbDevice *this,QKmsScreenConfig *screenConfig)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (Data *)0x0;
  local_50.d = (Data *)0x0;
  local_50.ptr = (char16_t *)0x0;
  local_38.ptr = L"/dev/dri/card0";
  local_50.size = 0;
  local_38.size = 0xe;
  QKmsDevice::QKmsDevice(&this->super_QKmsDevice,screenConfig,(QString *)&local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  (this->super_QKmsDevice)._vptr_QKmsDevice = (_func_int **)&PTR__QLinuxFbDevice_0014fd88;
  (this->m_outputs).d.size = 0;
  (this->m_outputs).d.d = (Data *)0x0;
  (this->m_outputs).d.ptr = (Output *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QLinuxFbDevice::QLinuxFbDevice(QKmsScreenConfig *screenConfig)
    : QKmsDevice(screenConfig, QStringLiteral("/dev/dri/card0"))
{
}